

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O2

void bonk_read(t_bonk *x,t_symbol *s)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  t_template_conflict *ptVar3;
  ulong uVar4;
  long lVar5;
  size_t oldsize;
  undefined4 *puVar6;
  uint uVar7;
  ulong uVar8;
  char *bufptr;
  float vec [200];
  char buf [1000];
  long local_748;
  char *local_740;
  undefined4 local_738 [200];
  char local_418 [1000];
  
  iVar1 = canvas_open(x->x_canvas,s->s_name,"",local_418,&local_740,1000,0);
  if ((-1 < iVar1) && (__stream = fdopen(iVar1,"r"), __stream != (FILE *)0x0)) {
    ptVar3 = (t_template_conflict *)resizebytes(x->x_template,(long)x->x_ntemplate * 800,0);
    x->x_template = ptVar3;
    iVar1 = x->x_nfilters;
    local_748 = 0;
    uVar8 = 0;
    do {
      puVar6 = local_738;
      iVar1 = iVar1 + 1;
      while (iVar1 = iVar1 + -1, iVar1 != 0) {
        iVar2 = __isoc99_fscanf(__stream,"%f",puVar6);
        puVar6 = puVar6 + 1;
        if (iVar2 < 1) {
          iVar1 = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) %
                       (long)x->x_ninsig);
          if (iVar1 != 0) {
            post("bonk_read: %d templates not a multiple of %d; dropping extras");
            uVar4 = uVar8 & 0xffffffff;
            uVar7 = (int)uVar8 - iVar1;
            uVar8 = (ulong)uVar7;
            ptVar3 = (t_template_conflict *)
                     resizebytes(x->x_template,uVar4 * 800,(long)(int)uVar7 * 800);
            x->x_template = ptVar3;
          }
          post("bonk: read %d templates\n",uVar8 & 0xffffffff);
          x->x_ntemplate = (int)uVar8;
          fclose(__stream);
          return;
        }
      }
      oldsize = uVar8 * 800;
      uVar8 = uVar8 + 1;
      ptVar3 = (t_template_conflict *)resizebytes(x->x_template,oldsize,oldsize + 800);
      x->x_template = ptVar3;
      iVar1 = x->x_nfilters;
      for (lVar5 = 0; iVar1 != (int)lVar5; lVar5 = lVar5 + 1) {
        *(undefined4 *)((long)ptVar3->t_amp + lVar5 * 4 + local_748) = local_738[lVar5];
      }
      local_748 = local_748 + 800;
    } while( true );
  }
  post("%s: open failed",s->s_name);
  return;
}

Assistant:

static void bonk_read(t_bonk *x, t_symbol *s)
{
    float vec[MAXNFILTERS];
    int i, ntemplate = 0, remaining;
    float *fp;
    t_float *fp2;

    /* fbar: canvas_open code taken from g_array.c */
    FILE *fd;
    char buf[MAXPDSTRING], *bufptr;
    int filedesc;

    if ((filedesc = canvas_open(x->x_canvas,
            s->s_name, "", buf, &bufptr, MAXPDSTRING, 0)) < 0 
                || !(fd = fdopen(filedesc, "r")))
    {
        post("%s: open failed", s->s_name);
        return;
    }
    x->x_template = (t_template *)t_resizebytes(x->x_template, 
        x->x_ntemplate * sizeof(t_template), 0);
    while (1)
    {
        for (i = x->x_nfilters, fp = vec; i--; fp++)
            if (fscanf(fd, "%f", fp) < 1) goto nomore;
        x->x_template = (t_template *)t_resizebytes(x->x_template,
            ntemplate * sizeof(t_template),
                (ntemplate + 1) * sizeof(t_template));
        for (i = x->x_nfilters, fp = vec,
             fp2 = x->x_template[ntemplate].t_amp; i--;)
            *fp2++ = *fp++;
        ntemplate++;
    }
nomore:
    if ((remaining = (ntemplate % x->x_ninsig)))
    {
        post("bonk_read: %d templates not a multiple of %d; dropping extras");
        x->x_template = (t_template *)t_resizebytes(x->x_template,
            ntemplate * sizeof(t_template),
                (ntemplate - remaining) * sizeof(t_template));
        ntemplate = ntemplate - remaining;
    }
    post("bonk: read %d templates\n", ntemplate);
    x->x_ntemplate = ntemplate;
    fclose(fd);
}